

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O3

void __thiscall ON_Decal::CImpl::SetMapping(CImpl *this,Mappings m)

{
  wchar_t *wsz;
  ON_XMLVariant local_100;
  
  if ((this->_cache).mapping != m) {
    (this->_cache).mapping = m;
    if ((uint)(m + Cylindrical) < 5) {
      wsz = (wchar_t *)
            (&DAT_006aa3ac + *(int *)(&DAT_006aa3ac + (ulong)(uint)(m + Cylindrical) * 4));
    }
    else {
      ON_REMOVE_ASAP_AssertEx
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_decals.cpp"
                 ,0xa7,"","false is false");
      wsz = L"none";
    }
    ::ON_XMLVariant::ON_XMLVariant(&local_100,wsz);
    if (this->_collection != (ON_DecalCollection *)0x0) {
      this->_collection->m_changed = true;
    }
    ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,L"",L"mapping",&local_100);
    ::ON_XMLVariant::~ON_XMLVariant(&local_100);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetMapping(Mappings m)
{
  if (_cache.mapping != m)
  {
    _cache.mapping = m;

    const wchar_t* s = L"";
    switch (m)
    {
    default: ON_ASSERT(false);
    case Mappings::None:        s = ON_RDK_DECAL_MAPPING_NONE;        break;
    case Mappings::Planar:      s = ON_RDK_DECAL_MAPPING_PLANAR;      break;
    case Mappings::Spherical:   s = ON_RDK_DECAL_MAPPING_SPHERICAL;   break;
    case Mappings::Cylindrical: s = ON_RDK_DECAL_MAPPING_CYLINDRICAL; break;
    case Mappings::UV:          s = ON_RDK_DECAL_MAPPING_UV;          break;
    }

    SetParameter(ON_RDK_DECAL_MAPPING, s);
  }
}